

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGMarkerElement::SVGMarkerElement(SVGMarkerElement *this,Document *document)

{
  SVGNodeList *pSVar1;
  _Fwd_list_node_base *p_Var2;
  
  (this->super_SVGElement).super_SVGNode.m_document = document;
  (this->super_SVGElement).super_SVGNode.m_parentElement = (SVGElement *)0x0;
  (this->super_SVGElement).super_SVGNode._vptr_SVGNode = (_func_int **)&PTR__SVGElement_001588c8;
  (this->super_SVGElement).m_paintBoundingBox.x = 0.0;
  (this->super_SVGElement).m_paintBoundingBox.y = 0.0;
  (this->super_SVGElement).m_paintBoundingBox.w = -1.0;
  (this->super_SVGElement).m_paintBoundingBox.h = -1.0;
  (this->super_SVGElement).m_clipper = (SVGClipPathElement *)0x0;
  (this->super_SVGElement).m_masker = (SVGMaskElement *)0x0;
  (this->super_SVGElement).m_opacity = 1.0;
  (this->super_SVGElement).m_font_size = 12.0;
  (this->super_SVGElement).m_display = Inline;
  (this->super_SVGElement).m_overflow = Visible;
  (this->super_SVGElement).m_visibility = Visible;
  (this->super_SVGElement).m_id = Marker;
  pSVar1 = &(this->super_SVGElement).m_children;
  (this->super_SVGElement).m_attributes.
  super__Fwd_list_base<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>._M_impl._M_head.
  _M_next = (_Fwd_list_node_base *)0x0;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->super_SVGElement).m_children.
  super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pSVar1;
  (this->super_SVGElement).m_children.
  super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pSVar1;
  (this->super_SVGElement).m_children.
  super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_SVGElement).super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGMarkerElement_00158c88;
  SVGFitToViewBox::SVGFitToViewBox(&this->super_SVGFitToViewBox,&this->super_SVGElement);
  (this->super_SVGElement).super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGMarkerElement_00158c88;
  SVGProperty::SVGProperty(&(this->m_refX).super_SVGProperty,RefX);
  (this->m_refX).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_refX).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_refX).super_SVGProperty.field_0xc = 0;
  (this->m_refX).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_refY).super_SVGProperty,RefY);
  (this->m_refY).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_refY).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_refY).super_SVGProperty.field_0xc = 0;
  (this->m_refY).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_markerWidth).super_SVGProperty,MarkerWidth);
  (this->m_markerWidth).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_markerWidth).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_markerWidth).super_SVGProperty.field_0xc = 0x40400000;
  (this->m_markerWidth).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_markerHeight).super_SVGProperty,MarkerHeight);
  (this->m_markerHeight).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_markerHeight).super_SVGProperty.field_0x9 = 0x101;
  *(undefined4 *)&(this->m_markerHeight).super_SVGProperty.field_0xc = 0x40400000;
  (this->m_markerHeight).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_markerUnits).super_SVGProperty,MarkerUnits);
  (this->m_markerUnits).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_00159340;
  (this->m_markerUnits).super_SVGProperty.field_0x9 = 0;
  SVGProperty::SVGProperty(&(this->m_orient).super_SVGProperty,Orient);
  (this->m_orient).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015adf0;
  *(undefined8 *)&(this->m_orient).super_SVGProperty.field_0xc = 0x200000000;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_refX;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_refY;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_markerWidth;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_markerHeight;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_markerUnits;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)&this->m_orient;
  p_Var2->_M_next =
       (this->super_SVGElement).m_properties.
       super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl
       ._M_head._M_next;
  (this->super_SVGElement).m_properties.
  super__Fwd_list_base<lunasvg::SVGProperty_*,_std::allocator<lunasvg::SVGProperty_*>_>._M_impl.
  _M_head._M_next = p_Var2;
  return;
}

Assistant:

SVGMarkerElement::SVGMarkerElement(Document* document)
    : SVGElement(document, ElementID::Marker)
    , SVGFitToViewBox(this)
    , m_refX(PropertyID::RefX, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_refY(PropertyID::RefY, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_markerWidth(PropertyID::MarkerWidth, LengthDirection::Horizontal, LengthNegativeMode::Forbid, 3.f, LengthUnits::None)
    , m_markerHeight(PropertyID::MarkerHeight, LengthDirection::Vertical, LengthNegativeMode::Forbid, 3.f, LengthUnits::None)
    , m_markerUnits(PropertyID::MarkerUnits, MarkerUnits::StrokeWidth)
    , m_orient(PropertyID::Orient)
{
    addProperty(m_refX);
    addProperty(m_refY);
    addProperty(m_markerWidth);
    addProperty(m_markerHeight);
    addProperty(m_markerUnits);
    addProperty(m_orient);
}